

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O0

int mxx::attr_map<int,_std::function<void_(void_*,_void_*,_int_*)>_>::copy_attr
              (MPI_Datatype param_1,int param_2,void *param_3,void *attribute_val_in,
              void *attribute_val_out,int *flag)

{
  function<void_(void_*,_void_*,_int_*)> *this;
  function<void_(void_*,_void_*,_int_*)> **out;
  int *flag_local;
  void *attribute_val_out_local;
  void *attribute_val_in_local;
  void *param_2_local;
  int param_1_local;
  MPI_Datatype param_0_local;
  
  this = (function<void_(void_*,_void_*,_int_*)> *)operator_new(0x20);
  std::function<void_(void_*,_void_*,_int_*)>::function
            (this,(function<void_(void_*,_void_*,_int_*)> *)attribute_val_in);
  *(function<void_(void_*,_void_*,_int_*)> **)attribute_val_out = this;
  *flag = 1;
  return 0;
}

Assistant:

static int copy_attr(MPI_Datatype, int, void*, void *attribute_val_in, void *attribute_val_out, int *flag) {
        T** out = (T**) attribute_val_out;
        // copy via copy constructor
        *out = new T(*(T*)(attribute_val_in));
        *flag = 1;
        return MPI_SUCCESS;
    }